

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  uint8_t uVar1;
  HTTP *pHVar2;
  char *pcVar3;
  size_t sVar4;
  uint32_t uVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  http_conn *c;
  Curl_easy *pCVar9;
  char *pcVar10;
  Curl_easy *pCVar11;
  size_t local_88;
  int h2;
  uint32_t max_conn;
  CURLcode result;
  int32_t stream_id;
  size_t ncopy;
  size_t left;
  int rv;
  Curl_easy *data;
  HTTP *stream;
  Curl_easy *data_s;
  http_conn *httpc;
  connectdata *conn;
  void *userp_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  c = (http_conn *)((long)userp + 0x448);
  pCVar9 = get_transfer(c);
  iVar7 = (frame->hd).stream_id;
  if (iVar7 == 0) {
    if ((frame->hd).type == '\x04') {
      iVar7 = *(int *)((long)userp + 0x4e8);
      uVar5 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
      *(uint32_t *)((long)userp + 0x4e8) = uVar5;
      uVar5 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
      *(bool *)((long)userp + 0x4ec) = uVar5 != 0;
      if (iVar7 != *(int *)((long)userp + 0x4e8)) {
        Curl_infof(pCVar9,"Connection state changed (MAX_CONCURRENT_STREAMS == %u)!",
                   (ulong)*(uint *)((long)userp + 0x4e8));
        multi_connchanged(pCVar9->multi);
      }
    }
    session_local._4_4_ = 0;
  }
  else {
    pCVar9 = (Curl_easy *)nghttp2_session_get_stream_user_data(session,iVar7);
    if (pCVar9 == (Curl_easy *)0x0) {
      session_local._4_4_ = 0;
    }
    else {
      pHVar2 = (pCVar9->req).p.http;
      if (pHVar2 == (HTTP *)0x0) {
        session_local._4_4_ = -0x386;
      }
      else {
        uVar1 = (frame->hd).type;
        if (uVar1 == '\0') {
          if ((pHVar2->bodystarted & 1U) == 0) {
            iVar7 = nghttp2_submit_rst_stream(session,'\0',iVar7,1);
            iVar7 = nghttp2_is_fatal(iVar7);
            if (iVar7 != 0) {
              return -0x386;
            }
          }
        }
        else if (uVar1 == '\x01') {
          if ((pHVar2->bodystarted & 1U) == 0) {
            if (pHVar2->status_code == -1) {
              return -0x386;
            }
            if (pHVar2->status_code / 100 != 1) {
              pHVar2->bodystarted = true;
              pHVar2->status_code = -1;
            }
            CVar6 = Curl_dyn_addn(&pHVar2->header_recvbuf,"\r\n",2);
            if (CVar6 != CURLE_OK) {
              return -0x386;
            }
            local_88 = Curl_dyn_len(&pHVar2->header_recvbuf);
            local_88 = local_88 - pHVar2->nread_header_recvbuf;
            if (pHVar2->len < local_88) {
              local_88 = pHVar2->len;
            }
            pcVar3 = pHVar2->mem;
            sVar4 = pHVar2->memlen;
            pcVar10 = Curl_dyn_ptr(&pHVar2->header_recvbuf);
            memcpy(pcVar3 + sVar4,pcVar10 + pHVar2->nread_header_recvbuf,local_88);
            pHVar2->nread_header_recvbuf = local_88 + pHVar2->nread_header_recvbuf;
            pHVar2->len = pHVar2->len - local_88;
            pHVar2->memlen = local_88 + pHVar2->memlen;
            drain_this(pCVar9,c);
            pCVar11 = get_transfer(c);
            if (pCVar11 != pCVar9) {
              Curl_expire(pCVar9,0,EXPIRE_RUN_NOW);
            }
          }
        }
        else if ((uVar1 == '\x05') &&
                (iVar7 = push_promise(pCVar9,(connectdata *)userp,&frame->push_promise), iVar7 != 0)
                ) {
          iVar8 = nghttp2_submit_rst_stream(session,'\0',(frame->push_promise).promised_stream_id,8)
          ;
          iVar8 = nghttp2_is_fatal(iVar8);
          if (iVar8 != 0) {
            return -0x386;
          }
          if (iVar7 == 2) {
            return -0x386;
          }
        }
        session_local._4_4_ = 0;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct http_conn *httpc = &conn->proto.httpc;
  struct Curl_easy *data_s = NULL;
  struct HTTP *stream = NULL;
  struct Curl_easy *data = get_transfer(httpc);
  int rv;
  size_t left, ncopy;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    if(frame->hd.type == NGHTTP2_SETTINGS) {
      uint32_t max_conn = httpc->settings.max_concurrent_streams;
      H2BUGF(infof(data, "Got SETTINGS"));
      httpc->settings.max_concurrent_streams =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
      httpc->settings.enable_push =
        nghttp2_session_get_remote_settings(
          session, NGHTTP2_SETTINGS_ENABLE_PUSH);
      H2BUGF(infof(data, "MAX_CONCURRENT_STREAMS == %d",
                   httpc->settings.max_concurrent_streams));
      H2BUGF(infof(data, "ENABLE_PUSH == %s",
                   httpc->settings.enable_push?"TRUE":"false"));
      if(max_conn != httpc->settings.max_concurrent_streams) {
        /* only signal change if the value actually changed */
        infof(data,
              "Connection state changed (MAX_CONCURRENT_STREAMS == %u)!",
              httpc->settings.max_concurrent_streams);
        multi_connchanged(data->multi);
      }
    }
    return 0;
  }
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    H2BUGF(infof(data,
                 "No Curl_easy associated with stream: %u",
                 stream_id));
    return 0;
  }

  stream = data_s->req.p.http;
  if(!stream) {
    H2BUGF(infof(data_s, "No proto pointer for stream: %u",
                 stream_id));
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  H2BUGF(infof(data_s, "on_frame_recv() header %x stream %u",
               frame->hd.type, stream_id));

  switch(frame->hd.type) {
  case NGHTTP2_DATA:
    /* If body started on this stream, then receiving DATA is illegal. */
    if(!stream->bodystarted) {
      rv = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     stream_id, NGHTTP2_PROTOCOL_ERROR);

      if(nghttp2_is_fatal(rv)) {
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  case NGHTTP2_HEADERS:
    if(stream->bodystarted) {
      /* Only valid HEADERS after body started is trailer HEADERS.  We
         buffer them in on_header callback. */
      break;
    }

    /* nghttp2 guarantees that :status is received, and we store it to
       stream->status_code. Fuzzing has proven this can still be reached
       without status code having been set. */
    if(stream->status_code == -1)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    /* Only final status code signals the end of header */
    if(stream->status_code / 100 != 1) {
      stream->bodystarted = TRUE;
      stream->status_code = -1;
    }

    result = Curl_dyn_addn(&stream->header_recvbuf, STRCONST("\r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    left = Curl_dyn_len(&stream->header_recvbuf) -
      stream->nread_header_recvbuf;
    ncopy = CURLMIN(stream->len, left);

    memcpy(&stream->mem[stream->memlen],
           Curl_dyn_ptr(&stream->header_recvbuf) +
           stream->nread_header_recvbuf,
           ncopy);
    stream->nread_header_recvbuf += ncopy;

    DEBUGASSERT(stream->mem);
    H2BUGF(infof(data_s, "Store %zu bytes headers from stream %u at %p",
                 ncopy, stream_id, stream->mem));

    stream->len -= ncopy;
    stream->memlen += ncopy;

    drain_this(data_s, httpc);
    /* if we receive data for another handle, wake that up */
    if(get_transfer(httpc) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);
    break;
  case NGHTTP2_PUSH_PROMISE:
    rv = push_promise(data_s, conn, &frame->push_promise);
    if(rv) { /* deny! */
      int h2;
      DEBUGASSERT((rv > CURL_PUSH_OK) && (rv <= CURL_PUSH_ERROROUT));
      h2 = nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                     frame->push_promise.promised_stream_id,
                                     NGHTTP2_CANCEL);
      if(nghttp2_is_fatal(h2))
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      else if(rv == CURL_PUSH_ERROROUT) {
        DEBUGF(infof(data_s, "Fail the parent stream (too)"));
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      }
    }
    break;
  default:
    H2BUGF(infof(data_s, "Got frame type %x for stream %u",
                 frame->hd.type, stream_id));
    break;
  }
  return 0;
}